

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O2

void emulator_set_builtin_palette(Emulator *e,u32 index)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  long lVar3;
  
  if (0x53 < index) {
    return;
  }
  uVar2 = *(undefined8 *)(emulator_set_builtin_palette::pals[index][0].color + 2);
  *(undefined8 *)e->color_to_rgba[0].color =
       *(undefined8 *)emulator_set_builtin_palette::pals[index][0].color;
  *(undefined8 *)(e->color_to_rgba[0].color + 2) = uVar2;
  update_bw_palette_rgba(e,PALETTE_TYPE_BGP);
  uVar2 = *(undefined8 *)(emulator_set_builtin_palette::pals[index][1].color + 2);
  *(undefined8 *)e->color_to_rgba[1].color =
       *(undefined8 *)emulator_set_builtin_palette::pals[index][1].color;
  *(undefined8 *)(e->color_to_rgba[1].color + 2) = uVar2;
  update_bw_palette_rgba(e,PALETTE_TYPE_OBP0);
  uVar2 = *(undefined8 *)(emulator_set_builtin_palette::pals[index][2].color + 2);
  *(undefined8 *)e->color_to_rgba[2].color =
       *(undefined8 *)emulator_set_builtin_palette::pals[index][2].color;
  *(undefined8 *)(e->color_to_rgba[2].color + 2) = uVar2;
  update_bw_palette_rgba(e,PALETTE_TYPE_OBP1);
  for (lVar3 = 0x33464; lVar3 != 0x334a4; lVar3 = lVar3 + 0x10) {
    uVar2 = *(undefined8 *)(emulator_set_builtin_palette::pals[index][0].color + 2);
    puVar1 = (undefined8 *)((long)(e->config).disable_sound + lVar3);
    *puVar1 = *(undefined8 *)emulator_set_builtin_palette::pals[index][0].color;
    puVar1[1] = uVar2;
  }
  update_bw_palette_rgba(e,PALETTE_TYPE_BGP);
  return;
}

Assistant:

void emulator_set_builtin_palette(Emulator* e, u32 index) {
  static const PaletteRGBA pals[][3] = {
#define PAL(b0, b1, b2, b3, o00, o01, o02, o03, o10, o11, o12, o13) \
  {{{b0, b1, b2, b3}}, {{o00, o01, o02, o03}}, {{o10, o11, o12, o13}}},
#define PAL3(c0, c1, c2, c3) \
  {{{c0, c1, c2, c3}}, {{c0, c1, c2, c3}}, {{c0, c1, c2, c3}}},
#include "builtin-palettes.def"
#undef PAL
#undef PAL3
  };
  size_t count = sizeof(pals) / sizeof(*pals);
  if (index >= count) { return; }
  emulator_set_bw_palette(e, 0, &pals[index][0]);
  emulator_set_bw_palette(e, 1, &pals[index][1]);
  emulator_set_bw_palette(e, 2, &pals[index][2]);
  for (int i = 0; i < 4; ++i) {
    SGB.screen_pal[i] = pals[index][0];
  }
  update_bw_palette_rgba(e, PALETTE_TYPE_BGP);
}